

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O1

void __thiscall
chrono::ChIntegrableIIorder::StateGather(ChIntegrableIIorder *this,ChState *y,double *T)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  Index size;
  Index size_1;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ChState mx;
  ChStateDelta mv;
  ChState local_48;
  ChStateDelta local_30;
  
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])();
  ChState::ChState(&local_48,(long)iVar11,y->integrable);
  iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  ChStateDelta::ChStateDelta(&local_30,(long)iVar11,y->integrable);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x16])(this,&local_48,&local_30,T);
  pdVar3 = (y->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (-1 < local_48.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ||
      pdVar3 == (double *)0x0) {
    if ((-1 < local_48.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
       (local_48.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
        (y->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
      uVar12 = local_48.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((((ulong)pdVar3 & 7) == 0) &&
         (uVar12 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7),
         local_48.super_ChVectorDynamic<double>.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
         (long)uVar12)) {
        uVar12 = local_48.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar14 = local_48.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
               uVar12;
      uVar13 = uVar14 + 7;
      if (-1 < (long)uVar14) {
        uVar13 = uVar14;
      }
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          pdVar3[uVar15] =
               local_48.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               [uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      uVar13 = (uVar13 & 0xfffffffffffffff8) + uVar12;
      if (7 < (long)uVar14) {
        do {
          pdVar1 = local_48.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   uVar12;
          dVar4 = pdVar1[1];
          dVar5 = pdVar1[2];
          dVar6 = pdVar1[3];
          dVar7 = pdVar1[4];
          dVar8 = pdVar1[5];
          dVar9 = pdVar1[6];
          dVar10 = pdVar1[7];
          pdVar2 = pdVar3 + uVar12;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar4;
          pdVar2[2] = dVar5;
          pdVar2[3] = dVar6;
          pdVar2[4] = dVar7;
          pdVar2[5] = dVar8;
          pdVar2[6] = dVar9;
          pdVar2[7] = dVar10;
          uVar12 = uVar12 + 8;
        } while ((long)uVar12 < (long)uVar13);
      }
      if ((long)uVar13 <
          local_48.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          pdVar3[uVar13] =
               local_48.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               [uVar13];
          uVar13 = uVar13 + 1;
        } while (local_48.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                 uVar13);
      }
      iVar11 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
      pdVar3 = (y->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if (local_30.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
          pdVar3 != (double *)0x0) goto LAB_0089216a;
      uVar12 = (ulong)iVar11;
      if ((-1 < (long)(local_30.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows | uVar12)) &&
         ((long)uVar12 <=
          (y->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
          local_30.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
        pdVar3 = pdVar3 + uVar12;
        uVar12 = local_30.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar12 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7),
           local_30.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
           (long)uVar12)) {
          uVar12 = local_30.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        }
        uVar14 = local_30.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
                 uVar12;
        uVar13 = uVar14 + 7;
        if (-1 < (long)uVar14) {
          uVar13 = uVar14;
        }
        if (0 < (long)uVar12) {
          uVar15 = 0;
          do {
            pdVar3[uVar15] =
                 local_30.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
        }
        uVar13 = (uVar13 & 0xfffffffffffffff8) + uVar12;
        if (7 < (long)uVar14) {
          do {
            pdVar1 = local_30.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     + uVar12;
            dVar4 = pdVar1[1];
            dVar5 = pdVar1[2];
            dVar6 = pdVar1[3];
            dVar7 = pdVar1[4];
            dVar8 = pdVar1[5];
            dVar9 = pdVar1[6];
            dVar10 = pdVar1[7];
            pdVar2 = pdVar3 + uVar12;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar4;
            pdVar2[2] = dVar5;
            pdVar2[3] = dVar6;
            pdVar2[4] = dVar7;
            pdVar2[5] = dVar8;
            pdVar2[6] = dVar9;
            pdVar2[7] = dVar10;
            uVar12 = uVar12 + 8;
          } while ((long)uVar12 < (long)uVar13);
        }
        if ((long)uVar13 <
            local_30.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            pdVar3[uVar13] =
                 local_30.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar13];
            uVar13 = uVar13 + 1;
          } while (local_30.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   != uVar13);
        }
        if (local_30.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
            (double *)0x0) {
          free((void *)local_30.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[-1]);
        }
        if (local_48.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
            (double *)0x0) {
          free((void *)local_48.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[-1]);
        }
        return;
      }
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
LAB_0089216a:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChIntegrableIIorder::StateGather(ChState& y, double& T)  {
    ChState mx(GetNcoords_x(), y.GetIntegrable());
    ChStateDelta mv(GetNcoords_v(), y.GetIntegrable());
    StateGather(mx, mv, T);
    y.segment(0, mx.size()) = mx;
    y.segment(GetNcoords_x(), mv.size()) = mv;
}